

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HexParsing.h
# Opt level: O3

string * __thiscall
jaegertracing::utils::HexParsing::readSegment_abi_cxx11_
          (string *__return_storage_ptr__,HexParsing *this,istream *in,size_t maxChars,char delim)

{
  long *plVar1;
  char ch;
  uint7 uStack_3f;
  undefined8 uStack_38;
  
  if ((in != (istream *)0x0) &&
     (plVar1 = (long *)std::istream::get((char *)this),
     (*(byte *)((long)plVar1 + *(long *)(*plVar1 + -0x18) + 0x20) & 5) == 0)) {
    if ((char)maxChars != '\0') {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
      return __return_storage_ptr__;
    }
    std::istream::putback((char)this);
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  (__return_storage_ptr__->field_2)._M_allocated_capacity = (ulong)uStack_3f << 8;
  *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = uStack_38;
  __return_storage_ptr__->_M_string_length = 0;
  return __return_storage_ptr__;
}

Assistant:

inline std::string readSegment(std::istream& in, size_t maxChars, char delim)
{
    std::string buffer;
    auto ch = '\0';
    for (auto i = static_cast<size_t>(0); i < maxChars && in.get(ch); ++i) {
        if (!isHex(ch)) {
            if (ch == delim) {
                in.putback(ch);
                break;
            }
            else {
                return "";
            }
        }

        buffer.push_back(ch);
    }
    return buffer;
}